

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

bool __thiscall
duckdb_re2::NFA::Search
          (NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Inst *pIVar4;
  long lVar5;
  long lVar6;
  const_pointer pcVar7;
  uint uVar8;
  char **ppcVar9;
  byte *p;
  IndexValue *pIVar10;
  long lVar11;
  byte *pbVar12;
  Thread *pTVar13;
  Threadq *nextq;
  uint uVar14;
  ulong uVar15;
  Threadq *runq;
  Threadq *nextq_00;
  _Elt_pointer pTVar16;
  StringPiece *pSVar17;
  bool bVar18;
  StringPiece context;
  StringPiece local_1d8;
  StringPiece *local_1c8;
  Threadq *local_1c0;
  deque<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_> *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->start_ == 0) {
    return (bool)'\0';
  }
  local_1d8.data_ = const_context->data_;
  local_1d8.size_ = const_context->size_;
  if ((byte *)local_1d8.data_ == (byte *)0x0) {
    local_1d8.data_ = text->data_;
    local_1d8.size_ = text->size_;
  }
  pcVar7 = local_1d8.data_;
  p = (byte *)text->data_;
  if (local_1d8.data_ <= p) {
    pbVar12 = p + text->size_;
    if (pbVar12 <= local_1d8.data_ + local_1d8.size_) {
      bVar1 = this->prog_->anchor_start_;
      if (((byte *)local_1d8.data_ != p & bVar1) != 0) {
        return (bool)'\0';
      }
      if (this->prog_->anchor_end_ == true) {
        if ((byte *)(local_1d8.data_ + local_1d8.size_) != pbVar12) {
          return (bool)'\0';
        }
        this->endmatch_ = true;
        longest = true;
      }
      if (-1 < nsubmatch) {
        uVar8 = nsubmatch * 2;
        this->ncapture_ = uVar8;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
          uVar8 = 2;
        }
        local_1c8 = submatch;
        ppcVar9 = (char **)operator_new__((ulong)uVar8 << 3);
        this->match_ = ppcVar9;
        memset(ppcVar9,0,(ulong)uVar8 << 3);
        this->matched_ = false;
        this->btext_ = pcVar7;
        this->etext_ = (char *)pbVar12;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        local_1b8 = &this->arena_;
        nextq = &this->q1_;
        runq = &this->q0_;
        pSVar17 = local_1c8;
        do {
          nextq_00 = nextq;
          uVar8 = 0xffffffff;
          if (p < this->etext_) {
            uVar8 = (uint)*p;
          }
          uVar8 = Step(this,runq,nextq_00,uVar8,&local_1d8,(char *)p);
          runq->size_ = 0;
          pbVar12 = (byte *)this->etext_;
          if (uVar8 != 0) {
            iVar2 = this->ncapture_;
            goto LAB_0048aa2b;
          }
          if (pbVar12 < p) goto LAB_0048aad5;
          nextq = runq;
          if (this->matched_ == false) {
            if (bVar1 == false && !anchored) {
              if ((((p < pbVar12) && (nextq_00->size_ == 0)) && (this->prog_->prefix_size_ != 0)) &&
                 (p = (byte *)Prog::PrefixAccel(this->prog_,p,(long)pbVar12 - (long)p),
                 p == (byte *)0x0)) {
                p = (byte *)this->etext_;
              }
            }
            else if (p != (byte *)text->data_) goto LAB_0048a9a8;
            pTVar13 = this->freelist_;
            local_1c0 = runq;
            if (pTVar13 == (Thread *)0x0) {
              pTVar16 = (this->arena_).
                        super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (pTVar16 ==
                  (this->arena_).
                  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::
                _M_push_back_aux<>(local_1b8);
                pTVar16 = (this->arena_).
                          super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              }
              else {
                (pTVar16->field_0).next = (Thread *)0x0;
                pTVar16->capture = (char **)0x0;
                pTVar16 = (this->arena_).
                          super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                (this->arena_).
                super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar16;
              }
              if (pTVar16 ==
                  (this->arena_).
                  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar16 = (this->arena_).
                          super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              pTVar13 = pTVar16 + -1;
              pTVar16[-1].field_0.ref = 1;
              uVar15 = (long)this->ncapture_ * 8;
              if ((long)this->ncapture_ < 0) {
                uVar15 = 0xffffffffffffffff;
              }
              ppcVar9 = (char **)operator_new__(uVar15);
              pTVar16[-1].capture = ppcVar9;
              pSVar17 = local_1c8;
            }
            else {
              this->freelist_ = (Thread *)pTVar13->field_0;
              (pTVar13->field_0).ref = 1;
            }
            memmove(pTVar13->capture,this->match_,(long)this->ncapture_ << 3);
            *pTVar13->capture = (char *)p;
            uVar8 = 0xffffffff;
            if (p < this->etext_) {
              uVar8 = (uint)*p;
            }
            AddToThreadq(this,nextq_00,this->start_,uVar8,&local_1d8,(char *)p,pTVar13);
            iVar2 = (pTVar13->field_0).ref;
            (pTVar13->field_0).ref = iVar2 + -1;
            nextq = local_1c0;
            if (iVar2 < 2) {
              pTVar13->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
              this->freelist_ = pTVar13;
            }
          }
LAB_0048a9a8:
          if (nextq_00->size_ == 0) goto LAB_0048ab1d;
          bVar18 = p != (byte *)0x0;
          p = p + 1;
          runq = nextq_00;
        } while (bVar18);
        Step(this,nextq_00,nextq,-1,&local_1d8,(char *)0x0);
        nextq_00->size_ = 0;
        nextq_00 = nextq;
        goto LAB_0048aad5;
      }
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Bad args: nsubmatch=",0x14);
      std::ostream::operator<<(local_1a8,nsubmatch);
      goto LAB_0048a709;
    }
  }
  local_1b0 = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"context does not contain text",0x1d);
LAB_0048a709:
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
LAB_0048aa2b:
  pIVar4 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
           ((long)&(this->prog_->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar3 = pIVar4[(int)uVar8].out_opcode_;
  uVar14 = uVar3 & 7;
  if (uVar14 == 3) {
    if (pIVar4[(int)uVar8].field_1.cap_ < iVar2) {
      this->match_[pIVar4[(int)uVar8].field_1.cap_] = (char *)pbVar12;
    }
  }
  else if (uVar14 != 6) goto LAB_0048aa64;
  uVar8 = uVar3 >> 4;
  goto LAB_0048aa2b;
LAB_0048aa64:
  if (uVar14 == 5) {
    this->match_[1] = (char *)pbVar12;
    this->matched_ = true;
  }
  else {
    local_1b0 = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unexpected opcode in short circuit: ",0x24);
    std::ostream::operator<<(local_1a8,pIVar4[(int)uVar8].out_opcode_ & 7);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    pSVar17 = local_1c8;
  }
LAB_0048aad5:
  if (nextq_00->size_ != 0) {
    pIVar10 = (nextq_00->dense_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl;
    do {
      pTVar13 = pIVar10->value_;
      if ((pTVar13 != (Thread *)0x0) &&
         (iVar2 = (pTVar13->field_0).ref, (pTVar13->field_0).ref = iVar2 + -1, iVar2 < 2)) {
        pTVar13->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
        this->freelist_ = pTVar13;
      }
      pIVar10 = pIVar10 + 1;
    } while (pIVar10 !=
             (nextq_00->dense_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
             .
             super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
             ._M_head_impl + nextq_00->size_);
  }
LAB_0048ab1d:
  if (this->matched_ == true && nsubmatch != 0) {
    lVar11 = 0;
    do {
      lVar5 = *(long *)((long)this->match_ + lVar11);
      lVar6 = *(long *)((long)this->match_ + lVar11 + 8);
      *(long *)((long)&pSVar17->data_ + lVar11) = lVar5;
      *(long *)((long)&pSVar17->size_ + lVar11) = lVar6 - lVar5;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uint)nsubmatch << 4 != lVar11);
    return (bool)'\x01';
  }
  return this->matched_;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (BeginPtr(text) < BeginPtr(context) || EndPtr(text) > EndPtr(context)) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && BeginPtr(context) != BeginPtr(text))
    return false;
  if (prog_->anchor_end() && EndPtr(context) != EndPtr(text))
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  memset(match_, 0, ncapture_*sizeof match_[0]);
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // Try to use prefix accel (e.g. memchr) to skip ahead.
      // The search must be unanchored and there must be zero
      // possible matches already.
      if (!anchored && runq->size() == 0 &&
          p < etext_ && prog_->can_prefix_accel()) {
        p = reinterpret_cast<const char*>(prog_->PrefixAccel(p, etext_ - p));
        if (p == NULL)
          p = etext_;
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      break;
    }

    // Avoid invoking undefined behavior (arithmetic on a null pointer)
    // by simply not continuing the loop.
    // This complements the special case in NFA::Step().
    if (p == NULL) {
      (void) Step(runq, nextq, -1, context, p);
      DCHECK_EQ(runq->size(), 0);
      using std::swap;
      swap(nextq, runq);
      nextq->clear();
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    if (i->value() != NULL)
      Decref(i->value());
  }

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    return true;
  }
  return false;
}